

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_SecureChannel_revolveTokens(UA_SecureChannel *channel)

{
  UA_UInt32 UVar1;
  undefined4 uVar2;
  UA_SecureChannel *channel_local;
  
  if ((channel->nextSecurityToken).tokenId != 0) {
    UVar1 = (channel->nextSecurityToken).tokenId;
    (channel->securityToken).channelId = (channel->nextSecurityToken).channelId;
    (channel->securityToken).tokenId = UVar1;
    (channel->securityToken).createdAt = (channel->nextSecurityToken).createdAt;
    uVar2 = *(undefined4 *)&(channel->nextSecurityToken).field_0x14;
    (channel->securityToken).revisedLifetime = (channel->nextSecurityToken).revisedLifetime;
    *(undefined4 *)&(channel->securityToken).field_0x14 = uVar2;
    UA_ChannelSecurityToken_init(&channel->nextSecurityToken);
  }
  return;
}

Assistant:

void UA_SecureChannel_revolveTokens(UA_SecureChannel *channel) {
    if(channel->nextSecurityToken.tokenId == 0) //no security token issued
        return;

    //FIXME: not thread-safe
    memcpy(&channel->securityToken, &channel->nextSecurityToken,
           sizeof(UA_ChannelSecurityToken));
    UA_ChannelSecurityToken_init(&channel->nextSecurityToken);
}